

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O1

void Map::dfs(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *visitedCountries,Country *country,bool continentTest)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer ppCVar3;
  iterator iVar4;
  Country **c;
  pointer ppCVar5;
  key_type local_50;
  
  paVar1 = &local_50.field_2;
  pcVar2 = (country->cyName->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + country->cyName->_M_string_length);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&visitedCountries->_M_t,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar4._M_node == &(visitedCountries->_M_t)._M_impl.super__Rb_tree_header) {
    pcVar2 = (country->cyName->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + country->cyName->_M_string_length);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)visitedCountries,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    ppCVar3 = (country->pAdjCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppCVar5 = (country->pAdjCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start; ppCVar5 != ppCVar3; ppCVar5 = ppCVar5 + 1) {
      if ((!continentTest) || (*(*ppCVar5)->cyContinent == *country->cyContinent)) {
        dfs(visitedCountries,*ppCVar5,continentTest);
      }
    }
  }
  return;
}

Assistant:

void Map::dfs(std::set<std::string>* visitedCountries,Country* country, bool continentTest){
    if(visitedCountries->find(country->getCountryName()) == visitedCountries->end()){
        visitedCountries->insert(country->getCountryName());
        for(auto& c : *country->getAdjCountries()) {
            if(!continentTest || c->getCountryContinent() == country->getCountryContinent()){
                dfs(visitedCountries,c, continentTest);
            }else{
                continue;
            }
        }
    }
}